

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

void __thiscall cmFileInstaller::DefaultFilePermissions(cmFileInstaller *this)

{
  int iVar1;
  cmMakefile *this_00;
  bool bVar2;
  uint uVar3;
  allocator local_41;
  string local_40;
  
  (this->super_cmFileCopier).FilePermissions = 0x1a4;
  iVar1 = *(int *)&(this->super_cmFileCopier).field_0xa4;
  if (iVar1 - 2U < 2) {
    this_00 = (this->super_cmFileCopier).Makefile;
    std::__cxx11::string::string((string *)&local_40,"CMAKE_INSTALL_SO_NO_EXE",&local_41);
    bVar2 = cmMakefile::IsOn(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar2) {
      return;
    }
    uVar3 = (this->super_cmFileCopier).FilePermissions | 0x49;
  }
  else {
    uVar3 = 0x1ed;
    if ((iVar1 != 0) && (iVar1 != 5)) {
      return;
    }
  }
  (this->super_cmFileCopier).FilePermissions = uVar3;
  return;
}

Assistant:

virtual void DefaultFilePermissions()
    {
    this->cmFileCopier::DefaultFilePermissions();
    // Add execute permissions based on the target type.
    switch(this->InstallType)
      {
      case cmInstallType_SHARED_LIBRARY:
      case cmInstallType_MODULE_LIBRARY:
        if(this->Makefile->IsOn("CMAKE_INSTALL_SO_NO_EXE"))
          {
          break;
          }
      case cmInstallType_EXECUTABLE:
      case cmInstallType_PROGRAMS:
        this->FilePermissions |= mode_owner_execute;
        this->FilePermissions |= mode_group_execute;
        this->FilePermissions |= mode_world_execute;
        break;
      default: break;
      }
    }